

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.hpp
# Opt level: O2

ConsumeResult * __thiscall
binlog::Session::consume<binlog::TextOutputStream>
          (ConsumeResult *__return_storage_ptr__,Session *this,TextOutputStream *out)

{
  pointer pcVar1;
  __shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *entry;
  size_t sVar4;
  size_t sVar5;
  __normal_iterator<std::shared_ptr<binlog::Session::Channel>_*,_std::vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>_>
  __first;
  size_t in_RCX;
  Queue *__n;
  pointer pcVar6;
  pointer __buf;
  size_t sVar7;
  shared_ptr<binlog::Session::Channel> *channelptr;
  __shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar8;
  Queue *local_78;
  QueueReader reader;
  ReadResult data;
  
  std::mutex::lock(&this->_mutex);
  __return_storage_ptr__->channelsPolled = 0;
  __return_storage_ptr__->channelsRemoved = 0;
  __return_storage_ptr__->bytesConsumed = 0;
  __return_storage_ptr__->totalBytesConsumed = 0;
  if (this->_consumeClockSync == true) {
    pcVar6 = (this->_clockSync)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    TextOutputStream::write
              (out,(int)pcVar6 + 0x18,
               (this->_clockSync)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish + (-0x18 - (long)pcVar6),in_RCX);
    pcVar6 = (this->_clockSync)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish +
             (-0x18 - (long)(this->_clockSync)._vector.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    __return_storage_ptr__->bytesConsumed = (size_t)pcVar6;
    this->_consumeClockSync = false;
  }
  else {
    pcVar6 = (pointer)0x0;
  }
  pcVar1 = (this->_sources)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = (Queue *)this->_sourcesConsumePos;
  __buf = (this->_sources)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish + (-(long)pcVar1 - (long)__n) + -0x18;
  TextOutputStream::write(out,(int)__n + (int)pcVar1 + 0x18,__buf,(size_t)__n);
  this->_sourcesConsumePos = (streamsize)(__buf + this->_sourcesConsumePos);
  pcVar6 = pcVar6 + (long)__buf;
  __return_storage_ptr__->bytesConsumed = (size_t)pcVar6;
  this_00 = &((this->_channels).
              super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>;
  p_Var2 = &((this->_channels).
             super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>;
  sVar7 = 1;
  local_78 = (Queue *)0x0;
  for (; this_00 != p_Var2; this_00 = this_00 + 1) {
    p_Var3 = (this_00->_M_refcount)._M_pi;
    if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar8 = false;
    }
    else {
      bVar8 = p_Var3->_M_use_count == 1;
    }
    entry = this_00->_M_ptr;
    reader._queue =
         (Queue *)((entry->_queue)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>.
                   _M_t.super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                   super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x10);
    reader._readEnd = 0;
    detail::QueueReader::beginRead(&data,&reader);
    if (data.size2 + data.size1 != 0) {
      (entry->writerProp).batchSize = data.size2 + data.size1;
      sVar4 = consumeSpecialEntry<binlog::WriterProp,binlog::TextOutputStream>
                        (this,&entry->writerProp,out);
      __return_storage_ptr__->bytesConsumed = (size_t)(pcVar6 + sVar4);
      TextOutputStream::write(out,(int)data.buffer1,(void *)data.size1,(size_t)__n);
      if (data.size2 == 0) {
        sVar5 = 0;
      }
      else {
        TextOutputStream::write(out,(int)data.buffer2,(void *)data.size2,(size_t)__n);
        sVar5 = data.size2;
      }
      ((reader._queue)->readIndex).super___atomic_base<unsigned_long>._M_i = reader._readEnd;
      pcVar6 = pcVar6 + sVar4 + sVar5 + data.size1;
      __return_storage_ptr__->bytesConsumed = (size_t)pcVar6;
      __n = reader._queue;
    }
    if (bVar8) {
      std::__shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>::reset(this_00);
      __n = (Queue *)((long)&(local_78->writeIndex).super___atomic_base<unsigned_long>._M_i + 1);
      __return_storage_ptr__->channelsRemoved = (size_t)__n;
      local_78 = __n;
    }
    __return_storage_ptr__->channelsPolled = sVar7;
    sVar7 = sVar7 + 1;
  }
  __first = std::
            __remove_if<__gnu_cxx::__normal_iterator<std::shared_ptr<binlog::Session::Channel>*,std::vector<std::shared_ptr<binlog::Session::Channel>,std::allocator<std::shared_ptr<binlog::Session::Channel>>>>,__gnu_cxx::__ops::_Iter_pred<binlog::Session::consume<binlog::TextOutputStream>(binlog::TextOutputStream&)::_lambda(std::shared_ptr<binlog::Session::Channel>const&)_1_>>
                      ((this->_channels).
                       super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->_channels).
                       super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  std::
  vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
  ::erase(&this->_channels,(const_iterator)__first._M_current,
          (this->_channels).
          super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  sVar7 = this->_totalConsumedBytes;
  this->_totalConsumedBytes = (size_t)(pcVar6 + sVar7);
  __return_storage_ptr__->totalBytesConsumed = (size_t)(pcVar6 + sVar7);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return __return_storage_ptr__;
}

Assistant:

Session::ConsumeResult Session::consume(OutputStream& out)
{
  // This lock:
  //  - Ensures only a single consumer is running at a time
  //  - Ensures safe read of _channels
  //  - Ensures safe read of Channel::writerProp (written by setChannelWriterName)
  //  - Ensures safe read of _sources
  //  - Ensures no new EventSource can be added to _sources while consuming
  //
  // Without this lock, the following becomes possible:
  //  - Consumer starts, consumes _sources
  //  - Producer1 adds a new elem (ES123) to sources
  //  - Producer2 finds that ES123 is already added
  //  - Producer2 adds a new event using ES123
  //  - Consumer continues, consumes the event added by Producer2
  // This would result in a corrupt stream, as the event source
  // must precede every event referencing it. This is solved by the lock
  // that blocks P1 *and* P2 while adding ES123.
  std::lock_guard<std::mutex> lock(_mutex);

  ConsumeResult result;

  // add a clock sync if not yet added
  if (_consumeClockSync)
  {
    out.write(_clockSync.data(), _clockSync.ssize());
    result.bytesConsumed += std::size_t(_clockSync.ssize());
    _consumeClockSync = false;
  }

  // consume event sources before events
  const std::streamsize sourceWriteSize = _sources.ssize() - _sourcesConsumePos;
  out.write(_sources.data() + _sourcesConsumePos, sourceWriteSize);
  _sourcesConsumePos += sourceWriteSize;
  result.bytesConsumed += std::size_t(sourceWriteSize);

  // consume some events
  for (std::shared_ptr<Channel>& channelptr : _channels)
  {
    // Important to check if channel is closed before beginRead,
    // otherwise the following race becomes possible:
    //  - Consumer finds queue is empty
    //  - Producer adds data
    //  - Producer closes the queue
    //  - Consumer finds queue is closed, removes it -> data loss
    const bool isClosed = (channelptr.use_count() == 1);

    Channel& ch = *channelptr;

    detail::QueueReader reader(ch.queue());
    const detail::QueueReader::ReadResult data = reader.beginRead();
    if (data.size())
    {
      // consume writerProp entry
      ch.writerProp.batchSize = data.size();
      result.bytesConsumed += consumeSpecialEntry(ch.writerProp, out);

      // consume queue data
      out.write(data.buffer1, std::streamsize(data.size1));
      if (data.size2)
      {
        // data wraps around the end of the queue, consume the second half as well
        out.write(data.buffer2, std::streamsize(data.size2));
      }

      reader.endRead();
      result.bytesConsumed += data.size();
    }

    if (isClosed)
    {
      // queue is empty and closed, remove it
      channelptr.reset();
      result.channelsRemoved++;
    }

    result.channelsPolled++;
  }

  // remove empty and closed channels
  _channels.erase(
    std::remove_if(
      _channels.begin(), _channels.end(),
      [](const std::shared_ptr<Channel>& channelptr) { return !channelptr; }
    ),
    _channels.end()
  );

  _totalConsumedBytes += result.bytesConsumed;
  result.totalBytesConsumed = _totalConsumedBytes;

  return result;
}